

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O0

unsigned_long __thiscall
duckdb::Deserializer::ReadPropertyWithDefault<unsigned_long>
          (Deserializer *this,field_id_t field_id,char *tag)

{
  ulong uVar1;
  undefined8 in_RDX;
  undefined2 in_SI;
  long *in_RDI;
  type ret;
  undefined8 local_8;
  
  uVar1 = (**(code **)(*in_RDI + 0x20))(in_RDI,in_SI,in_RDX,in_SI);
  if ((uVar1 & 1) == 0) {
    (**(code **)(*in_RDI + 0x28))(in_RDI,0);
    local_8 = SerializationDefaultValue::GetDefault<unsigned_long>();
  }
  else {
    local_8 = Read<unsigned_long>((Deserializer *)0xaefbe1);
    (**(code **)(*in_RDI + 0x28))(in_RDI,1);
  }
  return local_8;
}

Assistant:

inline T ReadPropertyWithDefault(const field_id_t field_id, const char *tag) {
		if (!OnOptionalPropertyBegin(field_id, tag)) {
			OnOptionalPropertyEnd(false);
			return std::forward<T>(SerializationDefaultValue::GetDefault<T>());
		}
		auto ret = Read<T>();
		OnOptionalPropertyEnd(true);
		return ret;
	}